

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int new_size;
  size_t sVar1;
  char *pcVar2;
  int local_44;
  int local_40;
  int local_3c;
  int new_capacity;
  int needed_sz;
  int write_off;
  int len;
  char *str_end_local;
  char *str_local;
  ImGuiTextBuffer *this_local;
  
  if (str_end == (char *)0x0) {
    sVar1 = strlen(str);
    local_3c = (int)sVar1;
  }
  else {
    local_3c = (int)str_end - (int)str;
  }
  if ((this->Buf).Size == 0) {
    local_40 = 1;
  }
  else {
    local_40 = (this->Buf).Size;
  }
  new_size = local_40 + local_3c;
  if ((this->Buf).Capacity <= local_40 + local_3c) {
    local_44 = (this->Buf).Capacity << 1;
    if (local_44 < new_size) {
      local_44 = new_size;
    }
    ImVector<char>::reserve(&this->Buf,local_44);
  }
  ImVector<char>::resize(&this->Buf,new_size);
  pcVar2 = ImVector<char>::operator[](&this->Buf,local_40 + -1);
  memcpy(pcVar2,str,(long)local_3c);
  pcVar2 = ImVector<char>::operator[](&this->Buf,local_40 + -1 + local_3c);
  *pcVar2 = '\0';
  return;
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}